

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * ID(void)

{
  treeNode *this;
  string local_28;
  
  match(ID,lackIdentifiter);
  this = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_28,(string *)&preToken.text);
  treeNode::treeNode(this,idExp,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return this;
}

Assistant:

treeNode* ID()
{
    match(Token::ID,Error::lackIdentifiter);
    return new treeNode(ExpKind::idExp,preToken.text);
}